

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O2

rect2d __thiscall rengine::rect2d::normalized(rect2d *this)

{
  vec2 vVar1;
  float fVar2;
  float fVar3;
  float fVar5;
  vec2 vVar4;
  float fVar6;
  rect2d rVar7;
  
  vVar1 = this->tl;
  vVar4 = this->br;
  fVar3 = vVar4.x;
  fVar6 = vVar1.x;
  fVar2 = fVar3;
  if (fVar6 <= fVar3) {
    fVar2 = fVar6;
  }
  fVar5 = vVar4.y;
  if (fVar3 <= fVar6) {
    vVar4 = (vec2)((ulong)vVar1 & 0xffffffff);
  }
  fVar6 = vVar1.y;
  fVar3 = fVar5;
  if (fVar6 <= fVar5) {
    fVar3 = fVar6;
  }
  rVar7.tl.y = fVar3;
  rVar7.tl.x = fVar2;
  if (fVar5 <= fVar6) {
    fVar5 = fVar6;
  }
  rVar7.br.x = vVar4.x;
  rVar7.br.y = fVar5;
  return rVar7;
}

Assistant:

rect2d normalized() const { return rect2d(min(tl, br), max(tl, br)); }